

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

char * __thiscall Json::ValueIteratorBase::index(ValueIteratorBase *this,char *__s,int __c)

{
  anon_union_4_2_4572b0f8_for_CZString_1 aVar1;
  CZString czstring;
  CZString local_18;
  
  Value::CZString::CZString(&local_18,(CZString *)((this->current_)._M_node + 1));
  aVar1 = local_18.field_1;
  if ((local_18.cstr_ != (char *)0x0) &&
     (aVar1.index_ = 0xffffffff, (local_18.field_1.index_ & 3) == 1)) {
    free(local_18.cstr_);
  }
  return (char *)(ulong)aVar1.index_;
}

Assistant:

Reader::Reader()
    : errors_(), document_(), begin_(), end_(), current_(), lastValueEnd_(),
      lastValue_(), commentsBefore_(), features_(Features::all()),
      collectComments_() {}